

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

void __thiscall
cfd::CoinSelection::ApproximateBestSubset
          (CoinSelection *this,vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *utxos,
          int64_t n_total_value,int64_t n_target_value,vector<char,_std::allocator<char>_> *vf_best,
          int64_t *n_best,int iterations)

{
  byte bVar1;
  undefined8 uVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  reference pvVar4;
  const_reference ppUVar5;
  long in_RCX;
  long in_RDX;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *in_RSI;
  long in_RDI;
  vector<char,_std::allocator<char>_> *in_R8;
  long *in_R9;
  bool bVar6;
  int in_stack_00000008;
  bool rand_bool;
  uint i;
  int n_pass;
  bool is_reached_target;
  int64_t n_total;
  int n_rep;
  vector<char,_std::allocator<char>_> vf_includes;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff20;
  vector<char,_std::allocator<char>_> *this_00;
  CfdException *this_01;
  bool local_bd;
  uint local_bc;
  int local_b8;
  long local_b0;
  int local_a0;
  vector<char,_std::allocator<char>_> local_98;
  undefined1 local_7d;
  string local_68 [16];
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  CfdSourceLocation local_48;
  long *local_30;
  vector<char,_std::allocator<char>_> *local_28;
  long local_20;
  long local_18;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *local_10;
  
  if ((in_R8 != (vector<char,_std::allocator<char>_> *)0x0) && (in_R9 != (long *)0x0)) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x55dedb);
    std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::size(local_10);
    std::vector<char,_std::allocator<char>_>::assign
              (in_stack_ffffffffffffff10,
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (value_type_conflict4 *)0x55df0c);
    *local_30 = local_18;
    local_a0 = 0;
    this_00 = local_28;
    while( true ) {
      bVar6 = false;
      if (local_a0 < in_stack_00000008) {
        bVar6 = *local_30 != local_20;
      }
      if (!bVar6) break;
      std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::size(local_10);
      std::vector<char,_std::allocator<char>_>::assign
                (in_stack_ffffffffffffff10,
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                 (value_type_conflict4 *)0x55df87);
      local_b0 = 0;
      bVar1 = 0;
      local_b8 = 0;
      while( true ) {
        bVar6 = false;
        if (local_b8 < 2) {
          bVar6 = (bool)(bVar1 ^ 1);
        }
        if (!bVar6) break;
        local_bc = 0;
        while( true ) {
          in_stack_ffffffffffffff10 = (vector<char,_std::allocator<char>_> *)(ulong)local_bc;
          pvVar3 = (vector<char,_std::allocator<char>_> *)
                   std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::size
                             (local_10);
          if (pvVar3 <= in_stack_ffffffffffffff10) break;
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_98,(ulong)local_bc);
          local_bd = *pvVar4 == '\0';
          if (local_b8 == 0) {
            in_stack_ffffffffffffff0f =
                 core::RandomNumberUtil::GetRandomBool
                           ((vector<bool,_std::allocator<bool>_> *)(in_RDI + 8));
            local_bd = (bool)in_stack_ffffffffffffff0f;
          }
          if (local_bd != false) {
            ppUVar5 = std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::operator[]
                                (local_10,(ulong)local_bc);
            local_b0 = (*ppUVar5)->effective_k_value + local_b0;
            pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_98,(ulong)local_bc)
            ;
            *pvVar4 = '\x01';
            if (local_20 <= local_b0) {
              bVar1 = 1;
              if (local_b0 < *local_30) {
                *local_30 = local_b0;
                std::vector<char,_std::allocator<char>_>::operator=
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
              }
              ppUVar5 = std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::
                        operator[](local_10,(ulong)local_bc);
              local_b0 = local_b0 - (*ppUVar5)->effective_k_value;
              pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                                 (&local_98,(ulong)local_bc);
              *pvVar4 = '\0';
            }
          }
          local_bc = local_bc + 1;
        }
        local_b8 = local_b8 + 1;
      }
      local_a0 = local_a0 + 1;
    }
    std::vector<char,_std::allocator<char>_>::~vector(this_00);
    return;
  }
  local_48.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
               ,0x2f);
  local_48.filename = local_48.filename + 1;
  local_48.line = 0x376;
  local_48.funcname = "ApproximateBestSubset";
  core::logger::warn<>(&local_48,"Outparameter(select_value) is nullptr.");
  local_7d = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  this_01 = (CfdException *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"Failed to select coin. Outparameter is nullptr.",(allocator *)this_01);
  core::CfdException::CfdException
            (this_01,(CfdError)((ulong)uVar2 >> 0x20),in_stack_ffffffffffffff20);
  local_7d = 0;
  __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CoinSelection::ApproximateBestSubset(
    const std::vector<const Utxo*>& utxos, int64_t n_total_value,
    int64_t n_target_value, std::vector<char>* vf_best, int64_t* n_best,
    int iterations) {
  if (vf_best == nullptr || n_best == nullptr) {
    warn(CFD_LOG_SOURCE, "Outparameter(select_value) is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to select coin. Outparameter is nullptr.");
  }

  std::vector<char> vf_includes;
  vf_best->assign(utxos.size(), true);
  *n_best = n_total_value;

  for (int n_rep = 0; n_rep < iterations && *n_best != n_target_value;
       n_rep++) {
    vf_includes.assign(utxos.size(), false);
    int64_t n_total = 0;
    bool is_reached_target = false;
    for (int n_pass = 0; n_pass < 2 && !is_reached_target; n_pass++) {
      for (unsigned int i = 0; i < utxos.size(); i++) {
        // The solver here uses a randomized algorithm,
        // the randomness serves no real security purpose but is just
        // needed to prevent degenerate behavior and it is important
        // that the rng is fast. We do not use a constant random sequence,
        // because there may be some privacy improvement by making
        // the selection random.
        bool rand_bool = !vf_includes[i];
        if (n_pass == 0) {
          rand_bool = RandomNumberUtil::GetRandomBool(&randomize_cache_);
        }
        if (rand_bool) {
          // n_total += utxos[i]->amount;
          n_total += utxos[i]->effective_k_value;
          vf_includes[i] = true;
          if (n_total >= n_target_value) {
            is_reached_target = true;
            if (n_total < *n_best) {
              *n_best = n_total;
              *vf_best = vf_includes;
            }
            // n_total -= utxos[i]->amount;
            n_total -= utxos[i]->effective_k_value;
            vf_includes[i] = false;
          }
        }
      }
    }
  }
}